

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_mtree.c
# Opt level: O0

int64_t mtree_atol10(char **p)

{
  char cVar1;
  char *pcVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  long local_48;
  bool local_3d;
  int local_3c;
  uint local_38;
  int sign;
  int digit;
  int base;
  int64_t last_digit_limit;
  int64_t limit;
  int64_t l;
  char **p_local;
  
  if (**p == '-') {
    local_3c = -1;
    last_digit_limit = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x8000000000000000)) / ZEXT816(10),0);
    _digit = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x8000000000000000)) % ZEXT816(10),0);
    *p = *p + 1;
  }
  else {
    local_3c = 1;
    auVar3._8_8_ = 0;
    auVar3._0_8_ = SUB168(SEXT816(0x7fffffffffffffff),8);
    last_digit_limit = SUB168((auVar3 << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(10),0);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = SUB168(SEXT816(0x7fffffffffffffff),8);
    _digit = SUB168((auVar4 << 0x40 | ZEXT816(0x7fffffffffffffff)) % SEXT816(10),0);
  }
  limit = 0;
  cVar1 = **p;
  while( true ) {
    local_38 = (int)cVar1 - 0x30;
    local_3d = 9 < local_38;
    if (local_3d) {
      if (local_3c < 0) {
        local_48 = -limit;
      }
      else {
        local_48 = limit;
      }
      return local_48;
    }
    if ((last_digit_limit < limit) || ((limit == last_digit_limit && (_digit < (int)local_38))))
    break;
    limit = limit * 10 + (long)(int)local_38;
    pcVar2 = *p;
    *p = pcVar2 + 1;
    cVar1 = pcVar2[1];
  }
  if (-1 < local_3c) {
    return 0x7fffffffffffffff;
  }
  return -0x8000000000000000;
}

Assistant:

static int64_t
mtree_atol10(char **p)
{
	int64_t l, limit, last_digit_limit;
	int base, digit, sign;

	base = 10;

	if (**p == '-') {
		sign = -1;
		limit = ((uint64_t)(INT64_MAX) + 1) / base;
		last_digit_limit = ((uint64_t)(INT64_MAX) + 1) % base;
		++(*p);
	} else {
		sign = 1;
		limit = INT64_MAX / base;
		last_digit_limit = INT64_MAX % base;
	}

	l = 0;
	digit = **p - '0';
	while (digit >= 0 && digit < base) {
		if (l > limit || (l == limit && digit > last_digit_limit))
			return (sign < 0) ? INT64_MIN : INT64_MAX;
		l = (l * base) + digit;
		digit = *++(*p) - '0';
	}
	return (sign < 0) ? -l : l;
}